

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# network4.c
# Opt level: O1

int net_tcp4_accept_socket(int s,uchar *ip,unsigned_short *port)

{
  int iVar1;
  uint uVar2;
  socklen_t len;
  uchar *ptr;
  sockaddr_in sa;
  socklen_t local_34;
  char *local_30;
  sockaddr local_28;
  
  local_34 = 0x10;
  iVar1 = accept(s,&local_28,&local_34);
  if (iVar1 == -1) {
    iVar1 = -1;
  }
  else {
    local_30 = local_28.sa_data;
    *(undefined4 *)ip = local_28.sa_data._2_4_;
    uVar2 = uint16_unpack__((uchar **)&local_30);
    *port = (unsigned_short)uVar2;
  }
  return iVar1;
}

Assistant:

int net_tcp4_accept_socket(int s,
                           unsigned char ip[4],
                           unsigned short *port) {
  struct sockaddr_in sa;
  socklen_t len = sizeof(sa);
  int fd;

  fd = accept(s, (struct sockaddr *)&sa, &len);
  if (fd == -1)
    return -1;

  memcpy(ip, (unsigned char *)&sa.sin_addr, 4);
  unsigned char *ptr = (unsigned char *)&sa.sin_port;
  *port = UINT16_UNPACK(ptr);

  return fd;
}